

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O0

float __thiscall
baryonyx::itm::quadratic_cost_type<float>::operator()
          (quadratic_cost_type<float> *this,int index,bit_array *x)

{
  int iVar1;
  int iVar2;
  type pfVar3;
  type piVar4;
  type pqVar5;
  int local_28;
  int last;
  int first;
  float ret;
  bit_array *x_local;
  int index_local;
  quadratic_cost_type<float> *this_local;
  
  pfVar3 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                     (&this->linear_elements,(long)index);
  last = (int)*pfVar3;
  piVar4 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[]
                     (&this->indices,(long)index);
  local_28 = *piVar4;
  piVar4 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[]
                     (&this->indices,(long)(index + 1));
  iVar1 = *piVar4;
  for (; local_28 != iVar1; local_28 = local_28 + 1) {
    pqVar5 = std::
             unique_ptr<baryonyx::itm::quadratic_cost_type<float>::quad[],_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
             ::operator[](&this->quadratic_elements,(long)local_28);
    iVar2 = bit_array::operator[](x,pqVar5->id);
    if (iVar2 != 0) {
      pqVar5 = std::
               unique_ptr<baryonyx::itm::quadratic_cost_type<float>::quad[],_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
               ::operator[](&this->quadratic_elements,(long)local_28);
      last = (int)(pqVar5->factor + (float)last);
    }
  }
  return (float)last;
}

Assistant:

Float operator()(int index, const bit_array& x) const noexcept
    {
        Float ret = linear_elements[index];

        auto first = indices[index];
        auto last = indices[index + 1];

        for (; first != last; ++first)
            if (x[quadratic_elements[first].id])
                ret += quadratic_elements[first].factor;

        return ret;
    }